

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError secs2ms(long *valp,char *str)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ParameterError PVar6;
  curl_off_t secs;
  char *local_30;
  long local_28;
  long local_20;
  
  PVar6 = PARAM_BAD_NUMERIC;
  if ((str != (char *)0x0) &&
     (local_30 = str, iVar3 = Curl_str_number(&local_30,&local_20,0x20c49ba5e353f6), iVar3 == 0)) {
    iVar3 = Curl_str_single(&local_30,'.');
    pcVar2 = local_30;
    PVar6 = PARAM_OK;
    if (iVar3 == 0) {
      iVar3 = Curl_str_number(&local_30,&local_28,0x7fffffffffffffff);
      if (iVar3 != 0) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      uVar5 = (long)local_30 - (long)pcVar2;
      lVar4 = local_28;
      if (0x147ae147ae147ae < local_28 || 8 < uVar5) {
        do {
          lVar4 = local_28 / 10;
          uVar5 = uVar5 - 1;
          bVar1 = 0xcccccccccccccd5 < local_28;
          local_28 = lVar4;
        } while (bVar1 || 8 < uVar5);
      }
      lVar4 = (lVar4 * 100) / (long)(ulong)(uint)(&DAT_00129aec)[uVar5];
    }
    else {
      lVar4 = 0;
    }
    *valp = local_20 * 1000 + lVar4;
  }
  return PVar6;
}

Assistant:

ParameterError secs2ms(long *valp, const char *str)
{
  curl_off_t secs;
  long ms = 0;
  const unsigned int digs[] = { 1, 10, 100, 1000, 10000, 1000000,
    1000000, 10000000, 100000000 };
  if(!str ||
     curlx_str_number(&str, &secs, LONG_MAX/1000 - 1))
    return PARAM_BAD_NUMERIC;
  if(!curlx_str_single(&str, '.')) {
    curl_off_t fracs;
    const char *s = str;
    size_t len;
    if(curlx_str_number(&str, &fracs, CURL_OFF_T_MAX))
      return PARAM_NUMBER_TOO_LARGE;
    /* how many milliseconds are in fracs ? */
    len = (str - s);
    while((len > sizeof(CURL_ARRAYSIZE(digs)) || (fracs > LONG_MAX/100))) {
      fracs /= 10;
      len--;
    }
    ms = ((long)fracs * 100) / digs[len - 1];
  }

  *valp = (long)secs * 1000 + ms;
  return PARAM_OK;
}